

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeStamp.cpp
# Opt level: O0

string * __thiscall
higan::TimeStamp::FormatToString_abi_cxx11_(string *__return_storage_ptr__,TimeStamp *this)

{
  allocator<char> local_39;
  char local_38 [8];
  char buffer [32];
  TimeStamp *this_local;
  
  buffer._24_8_ = this;
  FormatToBuffer(this,local_38,0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_38,&local_39);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string TimeStamp::FormatToString() const
{
	char buffer[32];
	FormatToBuffer(buffer, sizeof buffer);
	return buffer;
}